

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

bool flatbuffers::anon_unknown_101::VerifyObject
               (Verifier *v,Schema *schema,Object *obj,Table *table,bool required)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  voffset_t vVar4;
  long lVar5;
  Object *pOVar6;
  long lVar7;
  Vector<signed_char,_unsigned_int> *vec;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_00;
  Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int> *vec_01;
  Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *vec_02;
  ushort uVar8;
  Field *pFVar9;
  Schema *pSVar10;
  long lVar11;
  Table *pTVar12;
  ulong uVar13;
  char *__function;
  Table utype;
  ushort uVar14;
  int iVar15;
  uint uVar16;
  Object *pOVar17;
  size_t elem_size;
  long lVar18;
  ushort uVar19;
  ulong uVar20;
  unsigned_short vtsize_5;
  ulong uVar21;
  Field *union_field;
  
  if (table == (Table *)0x0) {
    return !required;
  }
  bVar2 = VerifierTemplate<false>::VerifyTableStart(v,(uint8_t *)table);
  if (!bVar2) {
    return false;
  }
  uVar21 = 0;
  do {
    lVar5 = -(long)*(int *)obj;
    if (*(ushort *)(obj + -(long)*(int *)obj) < 7) {
      uVar14 = 0;
    }
    else {
      uVar14 = *(ushort *)(obj + lVar5 + 6);
    }
    uVar1 = *(uint *)(obj + (ulong)*(uint *)(obj + uVar14) + (ulong)uVar14);
    if (uVar1 <= uVar21) goto LAB_0015140c;
    if (*(ushort *)(obj + -(long)*(int *)obj) < 7) {
      uVar14 = 0;
    }
    else {
      uVar14 = *(ushort *)(obj + lVar5 + 6);
    }
    if (uVar14 == 0) {
      pOVar6 = (Object *)0x0;
    }
    else {
      pOVar6 = obj + (ulong)*(uint *)(obj + uVar14) + (ulong)uVar14;
    }
    if (*(uint *)pOVar6 <= uVar21) {
      __function = 
      "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Field>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Field>, SizeT = unsigned int]"
      ;
      goto LAB_00151439;
    }
    uVar20 = (ulong)(uint)((int)uVar21 * 4);
    lVar5 = *(uint *)(pOVar6 + uVar20 + 4) + uVar20;
    union_field = (Field *)(pOVar6 + lVar5 + 4);
    lVar7 = -(long)*(int *)union_field;
    uVar14 = *(ushort *)(union_field + -(long)*(int *)union_field);
    if (uVar14 < 7) {
      uVar8 = 0;
    }
    else {
      uVar8 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 10);
    }
    if (uVar8 == 0) {
      pFVar9 = (Field *)0x0;
    }
    else {
      pFVar9 = union_field + (ulong)*(uint *)(union_field + uVar8) + (ulong)uVar8;
    }
    iVar15 = 0;
    uVar20 = 0;
    if (4 < *(ushort *)(pFVar9 + -(long)*(int *)pFVar9)) {
      uVar20 = (ulong)*(ushort *)(pFVar9 + (4 - (long)*(int *)pFVar9));
    }
    if ((short)uVar20 != 0) {
      iVar15 = (int)(char)pFVar9[uVar20].super_Table;
    }
    switch(iVar15) {
    case 0:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                    ,0xb2,
                    "bool flatbuffers::(anonymous namespace)::VerifyObject(flatbuffers::Verifier &, const reflection::Schema &, const reflection::Object &, const flatbuffers::Table *, bool)"
                   );
    case 1:
    case 2:
    case 3:
    case 4:
      if (uVar14 < 0xb) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
      }
      if (uVar14 == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(union_field + uVar14);
      }
      if (uVar14 < *(ushort *)(table + -(long)*(int *)table)) {
        uVar14 = *(ushort *)(table + ((ulong)uVar14 - (long)*(int *)table));
      }
      else {
        uVar14 = 0;
      }
      if ((uVar14 == 0) ||
         ((1 < v->size_ && (table + ((ulong)uVar14 - (long)v->buf_) <= (Table *)(v->size_ - 1)))))
      goto LAB_00150e70;
      goto LAB_00151402;
    case 5:
    case 6:
      if (uVar14 < 0xb) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
      }
      if (uVar14 == 0) {
        vVar4 = 0;
      }
      else {
        vVar4 = *(voffset_t *)(union_field + uVar14);
      }
      bVar2 = Table::VerifyField<short>(table,v,vVar4,2);
      break;
    case 7:
    case 8:
      if (uVar14 < 0xb) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
      }
      if (uVar14 == 0) {
        vVar4 = 0;
      }
      else {
        vVar4 = *(voffset_t *)(union_field + uVar14);
      }
      bVar2 = Table::VerifyField<int>(table,v,vVar4,4);
      break;
    case 9:
    case 10:
      if (uVar14 < 0xb) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
      }
      if (uVar14 == 0) {
        vVar4 = 0;
      }
      else {
        vVar4 = *(voffset_t *)(union_field + uVar14);
      }
      bVar2 = Table::VerifyField<long>(table,v,vVar4,8);
      break;
    case 0xb:
      if (uVar14 < 0xb) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
      }
      if (uVar14 == 0) {
        vVar4 = 0;
      }
      else {
        vVar4 = *(voffset_t *)(union_field + uVar14);
      }
      bVar2 = Table::VerifyField<float>(table,v,vVar4,4);
      break;
    case 0xc:
      if (uVar14 < 0xb) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
      }
      if (uVar14 == 0) {
        vVar4 = 0;
      }
      else {
        vVar4 = *(voffset_t *)(union_field + uVar14);
      }
      bVar2 = Table::VerifyField<double>(table,v,vVar4,8);
      break;
    case 0xd:
      if (uVar14 < 0xb) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
      }
      if (uVar14 == 0) {
        vVar4 = 0;
      }
      else {
        vVar4 = *(voffset_t *)(union_field + uVar14);
      }
      bVar2 = Table::VerifyField<unsigned_int>(table,v,vVar4,4);
      if (!bVar2) {
LAB_00151402:
        if (uVar21 < uVar1) {
          return false;
        }
LAB_0015140c:
        v->depth_ = v->depth_ - 1;
        return true;
      }
      lVar7 = -(long)*(int *)union_field;
      if (*(ushort *)(union_field + -(long)*(int *)union_field) < 7) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 10);
      }
      if (uVar14 == 0) {
        pFVar9 = (Field *)0x0;
      }
      else {
        pFVar9 = union_field + (ulong)*(uint *)(union_field + uVar14) + (ulong)uVar14;
      }
      if (*(ushort *)(pFVar9 + -(long)*(int *)pFVar9) < 5) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pFVar9 + (4 - (long)*(int *)pFVar9));
      }
      if ((uVar14 == 0) || (pFVar9[uVar14].super_Table != (Table)0xd)) {
        __assert_fail("field.type()->base_type() == reflection::String",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                      ,0x8b,
                      "const String *flatbuffers::GetFieldS(const Table &, const reflection::Field &)"
                     );
      }
      if (*(ushort *)(union_field + -(long)*(int *)union_field) < 0xb) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
      }
      if (uVar14 == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(union_field + uVar14);
      }
      if (uVar14 < *(ushort *)(table + -(long)*(int *)table)) {
        uVar14 = *(ushort *)(table + ((ulong)uVar14 - (long)*(int *)table));
      }
      else {
        uVar14 = 0;
      }
      if (uVar14 == 0) {
        pTVar12 = (Table *)0x0;
      }
      else {
        pTVar12 = table + (ulong)*(uint *)(table + uVar14) + (ulong)uVar14;
      }
      bVar2 = VerifierTemplate<false>::VerifyString(v,(String *)pTVar12);
      break;
    case 0xe:
      if (uVar14 < 7) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 10);
      }
      uVar20 = (ulong)uVar8;
      lVar18 = *(uint *)(union_field + uVar20) + uVar20;
      if (*(ushort *)
           (union_field +
           (lVar18 - *(int *)(union_field + *(uint *)(union_field + uVar20) + uVar20))) < 5) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ushort *)
                 (union_field +
                 ((lVar18 + 4) -
                 (long)*(int *)(union_field + *(uint *)(union_field + uVar20) + uVar20)));
      }
      if ((uVar8 == 0) || (union_field[(ulong)uVar8 + lVar18].super_Table != (Table)0xe)) {
        __assert_fail("vec_field.type()->base_type() == reflection::Vector",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                      ,0x5e,
                      "bool flatbuffers::(anonymous namespace)::VerifyVector(flatbuffers::Verifier &, const reflection::Schema &, const flatbuffers::Table &, const reflection::Field &)"
                     );
      }
      if (uVar14 < 0xb) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
      }
      if (uVar14 == 0) {
        vVar4 = 0;
      }
      else {
        vVar4 = *(voffset_t *)(union_field + uVar14);
      }
      bVar2 = Table::VerifyField<unsigned_int>(table,v,vVar4,4);
      if (bVar2) {
        lVar7 = -(long)*(int *)union_field;
        uVar14 = *(ushort *)(union_field + -(long)*(int *)union_field);
        if (uVar14 < 7) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 10);
        }
        uVar20 = (ulong)uVar8;
        lVar18 = *(uint *)(union_field + uVar20) + uVar20;
        iVar15 = 0;
        uVar13 = 0;
        if (6 < *(ushort *)
                 (union_field +
                 (lVar18 - *(int *)(union_field + *(uint *)(union_field + uVar20) + uVar20)))) {
          uVar13 = (ulong)*(ushort *)
                           (union_field +
                           ((lVar18 + 6) -
                           (long)*(int *)(union_field + *(uint *)(union_field + uVar20) + uVar20)));
        }
        if ((short)uVar13 != 0) {
          iVar15 = (int)(char)union_field[uVar13 + lVar18].super_Table;
        }
        switch(iVar15) {
        case 1:
          vec = (Vector<signed_char,_unsigned_int> *)GetFieldV<unsigned_char>(table,union_field);
          goto LAB_001510a2;
        case 2:
        case 3:
        case 4:
          vec = GetFieldV<signed_char>(table,union_field);
LAB_001510a2:
          if (vec == (Vector<signed_char,_unsigned_int> *)0x0) goto LAB_00150e70;
          elem_size = 1;
LAB_001510b0:
          bVar2 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                            (v,(uint8_t *)vec,elem_size,(size_t *)0x0);
          break;
        case 5:
        case 6:
          vec = (Vector<signed_char,_unsigned_int> *)GetFieldV<short>(table,union_field);
          if (vec == (Vector<signed_char,_unsigned_int> *)0x0) goto LAB_00150e70;
          elem_size = 2;
          goto LAB_001510b0;
        case 7:
        case 8:
          vec = (Vector<signed_char,_unsigned_int> *)GetFieldV<int>(table,union_field);
          goto LAB_00151001;
        case 9:
        case 10:
          vec = (Vector<signed_char,_unsigned_int> *)GetFieldV<long>(table,union_field);
          goto LAB_00150fa6;
        case 0xb:
          vec = (Vector<signed_char,_unsigned_int> *)GetFieldV<float>(table,union_field);
LAB_00151001:
          if (vec == (Vector<signed_char,_unsigned_int> *)0x0) goto LAB_00150e70;
          elem_size = 4;
          goto LAB_001510b0;
        case 0xc:
          vec = (Vector<signed_char,_unsigned_int> *)GetFieldV<double>(table,union_field);
LAB_00150fa6:
          if (vec == (Vector<signed_char,_unsigned_int> *)0x0) goto LAB_00150e70;
          elem_size = 8;
          goto LAB_001510b0;
        case 0xd:
          vec_00 = GetFieldV<flatbuffers::Offset<flatbuffers::String>>(table,union_field);
          if ((vec_00 == (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0) ||
             (bVar2 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                (v,(uint8_t *)vec_00,4,(size_t *)0x0), bVar2)) {
            bVar2 = VerifierTemplate<false>::VerifyVectorOfStrings(v,vec_00);
            goto LAB_00150e68;
          }
          goto LAB_00151402;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                        ,0xa5,
                        "bool flatbuffers::(anonymous namespace)::VerifyVector(flatbuffers::Verifier &, const reflection::Schema &, const flatbuffers::Table &, const reflection::Field &)"
                       );
        case 0xf:
          if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
            uVar8 = 0;
          }
          else {
            uVar8 = *(ushort *)(schema + (4 - (long)*(int *)schema));
          }
          if (uVar8 == 0) {
            pSVar10 = (Schema *)0x0;
          }
          else {
            pSVar10 = schema + (ulong)*(uint *)(schema + uVar8) + (ulong)uVar8;
          }
          if (uVar14 < 7) {
            uVar8 = 0;
          }
          else {
            uVar8 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 10);
          }
          uVar20 = (ulong)uVar8;
          lVar18 = *(uint *)(union_field + uVar20) + uVar20;
          if (*(ushort *)
               (union_field +
               (lVar18 - *(int *)(union_field + *(uint *)(union_field + uVar20) + uVar20))) < 9) {
            uVar8 = 0;
          }
          else {
            uVar8 = *(ushort *)
                     (union_field +
                     ((lVar18 + 8) -
                     (long)*(int *)(union_field + *(uint *)(union_field + uVar20) + uVar20)));
          }
          if (uVar8 == 0) {
            uVar16 = 0xffffffff;
          }
          else {
            uVar16 = *(uint *)(union_field + (ulong)uVar8 + lVar18);
          }
          if (*(uint *)pSVar10 <= uVar16) goto LAB_001514a0;
          lVar18 = (ulong)*(uint *)(pSVar10 + (ulong)(uVar16 << 2) + 4) + (ulong)(uVar16 << 2);
          pOVar17 = (Object *)(pSVar10 + lVar18 + 4);
          if (*(ushort *)(pOVar17 + -(long)*(int *)pOVar17) < 9) {
            uVar8 = 0;
          }
          else {
            uVar8 = *(ushort *)(pSVar10 + ((lVar18 + 0xc) - (long)*(int *)pOVar17));
          }
          if ((uVar8 == 0) || (pOVar17[uVar8].super_Table == (Table)0x0)) {
            vec_02 = GetFieldV<flatbuffers::Offset<flatbuffers::Table>>(table,union_field);
            if (vec_02 == (Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *)0x0)
            goto LAB_00150e70;
            bVar2 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                              (v,(uint8_t *)vec_02,4,(size_t *)0x0);
            if (((bVar2 && vec_02 != (Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>
                                      *)0x0) && (bVar2 = *(int *)vec_02 == 0, !bVar2)) &&
               (bVar3 = VerifyObject(v,schema,pOVar17,
                                     (Table *)(vec_02 + (ulong)*(uint *)(vec_02 + 4) + 4),true),
               bVar3)) {
              uVar20 = 0;
              uVar16 = 4;
              do {
                uVar20 = uVar20 + 1;
                bVar2 = *(uint *)vec_02 <= uVar20;
                if (bVar2) break;
                bVar3 = VerifyObject(v,schema,pOVar17,
                                     (Table *)(vec_02 + (ulong)*(uint *)(vec_02 + (ulong)uVar16 + 4)
                                                        + (ulong)uVar16 + 4),true);
                uVar16 = uVar16 + 4;
              } while (bVar3);
            }
          }
          else {
            if (uVar14 < 0xb) {
              uVar8 = 0;
            }
            else {
              uVar8 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
            }
            if (uVar8 == 0) {
              vVar4 = 0;
            }
            else {
              vVar4 = *(voffset_t *)(union_field + uVar8);
            }
            if (uVar14 < 0x13) {
              uVar14 = 0;
            }
            else {
              uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0x16);
            }
            if (uVar14 == 0) {
              bVar2 = false;
            }
            else {
              bVar2 = union_field[uVar14].super_Table != (Table)0x0;
            }
            bVar2 = VerifyVectorOfStructs(v,table,vVar4,pOVar17,bVar2);
          }
          break;
        case 0x10:
          vec_01 = GetFieldV<flatbuffers::Offset<unsigned_char>>(table,union_field);
          if (vec_01 == (Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int> *)0x0)
          goto LAB_00150e70;
          bVar2 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                            (v,(uint8_t *)vec_01,4,(size_t *)0x0);
          if (bVar2 && vec_01 != (Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int> *)0x0) {
            if (*(ushort *)(union_field + -(long)*(int *)union_field) < 0xb) {
              uVar14 = 0;
            }
            else {
              uVar14 = *(ushort *)(pOVar6 + ((lVar5 + 0xe) - (long)*(int *)union_field));
            }
            if (uVar14 == 0) {
              uVar14 = 0xfffe;
            }
            else {
              uVar14 = *(short *)(union_field + uVar14) - 2;
            }
            if (uVar14 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar14 = *(ushort *)(table + ((ulong)uVar14 - (long)*(int *)table));
            }
            else {
              uVar14 = 0;
            }
            if (uVar14 == 0) {
              pTVar12 = (Table *)0x0;
            }
            else {
              pTVar12 = table + (ulong)*(uint *)(table + uVar14) + (ulong)uVar14;
            }
            if ((pTVar12 != (Table *)0x0) &&
               (bVar2 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                  (v,(uint8_t *)pTVar12,1,(size_t *)0x0), !bVar2))
            goto LAB_00151402;
            bVar2 = *(int *)vec_01 == 0;
            if (!bVar2) {
              uVar16 = 0;
              uVar20 = 0;
              do {
                if (*(uint *)pTVar12 <= uVar20) {
                  __function = 
                  "return_type flatbuffers::Vector<unsigned char>::Get(SizeT) const [T = unsigned char, SizeT = unsigned int]"
                  ;
                  goto LAB_00151439;
                }
                bVar3 = VerifyUnion(v,schema,(uint8_t)pTVar12[uVar20 + 4],
                                    (uint8_t *)
                                    (vec_01 + (ulong)*(uint *)(vec_01 + (ulong)uVar16 + 4) +
                                              (ulong)uVar16 + 4),union_field);
                if (!bVar3) break;
                uVar20 = uVar20 + 1;
                uVar16 = uVar16 + 4;
                bVar2 = uVar20 >= *(uint *)vec_01;
              } while (uVar20 < *(uint *)vec_01);
            }
          }
        }
        if (bVar2 != false) goto LAB_00150e70;
      }
      goto LAB_00151402;
    case 0xf:
      if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ushort *)(schema + (4 - (long)*(int *)schema));
      }
      if (uVar8 == 0) {
        pSVar10 = (Schema *)0x0;
      }
      else {
        pSVar10 = schema + (ulong)*(uint *)(schema + uVar8) + (ulong)uVar8;
      }
      if (uVar14 < 7) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 10);
      }
      if (uVar8 == 0) {
        pFVar9 = (Field *)0x0;
      }
      else {
        pFVar9 = union_field + (ulong)*(uint *)(union_field + uVar8) + (ulong)uVar8;
      }
      if (*(ushort *)(pFVar9 + -(long)*(int *)pFVar9) < 9) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ushort *)(pFVar9 + (8 - (long)*(int *)pFVar9));
      }
      if (uVar8 == 0) {
        uVar16 = 0xffffffff;
      }
      else {
        uVar16 = *(uint *)(pFVar9 + uVar8);
      }
      if (*(uint *)pSVar10 <= uVar16) {
LAB_001514a0:
        __function = 
        "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
        ;
LAB_00151439:
        __assert_fail("i < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                      ,0xc1,__function);
      }
      lVar18 = (ulong)*(uint *)(pSVar10 + (ulong)(uVar16 << 2) + 4) + (ulong)(uVar16 << 2);
      pOVar17 = (Object *)(pSVar10 + lVar18 + 4);
      lVar11 = -(long)*(int *)pOVar17;
      uVar8 = *(ushort *)(pOVar17 + -(long)*(int *)pOVar17);
      if (uVar8 < 9) {
        uVar19 = 0;
      }
      else {
        uVar19 = *(ushort *)(pSVar10 + lVar11 + lVar18 + 0xc);
      }
      if ((uVar19 == 0) || (pOVar17[uVar19].super_Table == (Table)0x0)) {
        if (uVar14 < 7) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 10);
        }
        if (uVar8 == 0) {
          pFVar9 = (Field *)0x0;
        }
        else {
          pFVar9 = union_field + (ulong)*(uint *)(union_field + uVar8) + (ulong)uVar8;
        }
        if (*(ushort *)(pFVar9 + -(long)*(int *)pFVar9) < 5) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(ushort *)(pFVar9 + (4 - (long)*(int *)pFVar9));
        }
        if ((uVar8 == 0) || (pFVar9[uVar8].super_Table != (Table)0xf)) {
          if (uVar14 < 7) {
            uVar8 = 0;
          }
          else {
            uVar8 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 10);
          }
          if (uVar8 == 0) {
            pFVar9 = (Field *)0x0;
          }
          else {
            pFVar9 = union_field + (ulong)*(uint *)(union_field + uVar8) + (ulong)uVar8;
          }
          if (*(ushort *)(pFVar9 + -(long)*(int *)pFVar9) < 5) {
            uVar8 = 0;
          }
          else {
            uVar8 = *(ushort *)(pFVar9 + (4 - (long)*(int *)pFVar9));
          }
          if ((uVar8 == 0) || (pFVar9[uVar8].super_Table != (Table)0x10)) goto LAB_00151443;
        }
        if (uVar14 < 0xb) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
        }
        if (uVar8 == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(ushort *)(union_field + uVar8);
        }
        if (uVar8 < *(ushort *)(table + -(long)*(int *)table)) {
          uVar8 = *(ushort *)(table + ((ulong)uVar8 - (long)*(int *)table));
        }
        else {
          uVar8 = 0;
        }
        if (uVar8 == 0) {
          pTVar12 = (Table *)0x0;
        }
        else {
          pTVar12 = table + (ulong)*(uint *)(table + uVar8) + (ulong)uVar8;
        }
        if (uVar14 < 0x13) {
          uVar14 = 0;
        }
        else {
          uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0x16);
        }
        if (uVar14 == 0) {
          bVar2 = false;
        }
        else {
          bVar2 = union_field[uVar14].super_Table != (Table)0x0;
        }
        bVar2 = VerifyObject(v,schema,pOVar17,pTVar12,bVar2);
        break;
      }
      if (uVar14 < 0xb) {
        uVar19 = 0;
      }
      else {
        uVar19 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
      }
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        uVar19 = *(ushort *)(union_field + uVar19);
      }
      if (uVar14 < 0x13) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0x16);
      }
      if (uVar14 == 0) {
        bVar2 = false;
      }
      else {
        bVar2 = union_field[uVar14].super_Table != (Table)0x0;
      }
      if (uVar19 < *(ushort *)(table + -(long)*(int *)table)) {
        uVar14 = *(ushort *)(table + ((ulong)uVar19 - (long)*(int *)table));
      }
      else {
        uVar14 = 0;
      }
      if (uVar14 == 0) {
        bVar2 = (bool)(bVar2 & uVar14 == 0 ^ 1);
      }
      else {
        if (uVar8 < 0xd) {
          uVar19 = 0;
        }
        else {
          uVar19 = *(ushort *)(pSVar10 + lVar11 + lVar18 + 0x10);
        }
        if (uVar19 == 0) {
          uVar20 = 0;
        }
        else {
          uVar20 = (ulong)*(int *)(pOVar17 + uVar19);
        }
        if (uVar8 < 0xb) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(ushort *)(pSVar10 + lVar11 + lVar18 + 0xe);
        }
        if (uVar8 == 0) {
          uVar13 = 0xffffffffffffffff;
        }
        else {
          uVar13 = (long)*(int *)(pOVar17 + uVar8) - 1;
        }
        if ((((ulong)(table + ((ulong)uVar14 - (long)v->buf_)) & uVar13) != 0) &&
           (((v->opts_).check_alignment & 1U) != 0)) goto LAB_00151402;
        bVar2 = table + ((ulong)uVar14 - (long)v->buf_) <= (Table *)(v->size_ - uVar20) &&
                uVar20 < v->size_;
      }
      if (bVar2) goto LAB_00150e70;
      goto LAB_00151402;
    case 0x10:
      if (uVar14 < 0xb) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
      }
      if (uVar8 == 0) {
        uVar8 = 0xfffe;
      }
      else {
        uVar8 = *(short *)(union_field + uVar8) - 2;
      }
      lVar18 = (long)*(int *)table;
      if (uVar8 < *(ushort *)(table + -lVar18)) {
        uVar8 = *(ushort *)(table + ((ulong)uVar8 - lVar18));
      }
      else {
        uVar8 = 0;
      }
      if (uVar8 == 0) {
        utype = (Table)0x0;
      }
      else {
        utype = table[uVar8];
      }
      if (uVar14 < 7) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 10);
      }
      if (uVar8 == 0) {
        pFVar9 = (Field *)0x0;
      }
      else {
        pFVar9 = union_field + (ulong)*(uint *)(union_field + uVar8) + (ulong)uVar8;
      }
      if (*(ushort *)(pFVar9 + -(long)*(int *)pFVar9) < 5) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ushort *)(pFVar9 + (4 - (long)*(int *)pFVar9));
      }
      if ((uVar8 == 0) || (pFVar9[uVar8].super_Table != (Table)0xf)) {
        if (uVar14 < 7) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 10);
        }
        if (uVar8 == 0) {
          pFVar9 = (Field *)0x0;
        }
        else {
          pFVar9 = union_field + (ulong)*(uint *)(union_field + uVar8) + (ulong)uVar8;
        }
        if (*(ushort *)(pFVar9 + -(long)*(int *)pFVar9) < 5) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(ushort *)(pFVar9 + (4 - (long)*(int *)pFVar9));
        }
        if ((uVar8 == 0) || (pFVar9[uVar8].super_Table != (Table)0x10)) {
LAB_00151443:
          __assert_fail("field.type()->base_type() == reflection::Obj || field.type()->base_type() == reflection::Union"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                        ,0xa2,
                        "Table *flatbuffers::GetFieldT(const Table &, const reflection::Field &)");
        }
      }
      if (uVar14 < 0xb) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(pOVar6 + lVar7 + lVar5 + 0xe);
      }
      if (uVar14 == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(union_field + uVar14);
      }
      if (uVar14 < *(ushort *)(table + -lVar18)) {
        uVar14 = *(ushort *)(table + ((ulong)uVar14 - lVar18));
      }
      else {
        uVar14 = 0;
      }
      if (uVar14 == 0) {
        pTVar12 = (Table *)0x0;
      }
      else {
        pTVar12 = table + (ulong)*(uint *)(table + uVar14) + (ulong)uVar14;
      }
      bVar2 = VerifyUnion(v,schema,(uint8_t)utype,(uint8_t *)pTVar12,union_field);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                    ,0xfb,
                    "bool flatbuffers::(anonymous namespace)::VerifyObject(flatbuffers::Verifier &, const reflection::Schema &, const reflection::Object &, const flatbuffers::Table *, bool)"
                   );
    }
LAB_00150e68:
    if (bVar2 == false) goto LAB_00151402;
LAB_00150e70:
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

static bool VerifyObject(flatbuffers::Verifier &v,
                         const reflection::Schema &schema,
                         const reflection::Object &obj,
                         const flatbuffers::Table *table, bool required) {
  if (!table) return !required;
  if (!table->VerifyTableStart(v)) return false;
  for (uoffset_t i = 0; i < obj.fields()->size(); i++) {
    auto field_def = obj.fields()->Get(i);
    switch (field_def->type()->base_type()) {
      case reflection::None: FLATBUFFERS_ASSERT(false); break;
      case reflection::UType:
        if (!table->VerifyField<uint8_t>(v, field_def->offset(),
                                         sizeof(uint8_t)))
          return false;
        break;
      case reflection::Bool:
      case reflection::Byte:
      case reflection::UByte:
        if (!table->VerifyField<int8_t>(v, field_def->offset(), sizeof(int8_t)))
          return false;
        break;
      case reflection::Short:
      case reflection::UShort:
        if (!table->VerifyField<int16_t>(v, field_def->offset(),
                                         sizeof(int16_t)))
          return false;
        break;
      case reflection::Int:
      case reflection::UInt:
        if (!table->VerifyField<int32_t>(v, field_def->offset(),
                                         sizeof(int32_t)))
          return false;
        break;
      case reflection::Long:
      case reflection::ULong:
        if (!table->VerifyField<int64_t>(v, field_def->offset(),
                                         sizeof(int64_t)))
          return false;
        break;
      case reflection::Float:
        if (!table->VerifyField<float>(v, field_def->offset(), sizeof(float)))
          return false;
        break;
      case reflection::Double:
        if (!table->VerifyField<double>(v, field_def->offset(), sizeof(double)))
          return false;
        break;
      case reflection::String:
        if (!table->VerifyField<uoffset_t>(v, field_def->offset(),
                                           sizeof(uoffset_t)) ||
            !v.VerifyString(flatbuffers::GetFieldS(*table, *field_def))) {
          return false;
        }
        break;
      case reflection::Vector:
        if (!VerifyVector(v, schema, *table, *field_def)) return false;
        break;
      case reflection::Obj: {
        auto child_obj = schema.objects()->Get(field_def->type()->index());
        if (child_obj->is_struct()) {
          if (!VerifyStruct(v, *table, field_def->offset(), *child_obj,
                            field_def->required())) {
            return false;
          }
        } else {
          if (!VerifyObject(v, schema, *child_obj,
                            flatbuffers::GetFieldT(*table, *field_def),
                            field_def->required())) {
            return false;
          }
        }
        break;
      }
      case reflection::Union: {
        //  get union type from the prev field
        voffset_t utype_offset = field_def->offset() - sizeof(voffset_t);
        auto utype = table->GetField<uint8_t>(utype_offset, 0);
        auto uval = reinterpret_cast<const uint8_t *>(
            flatbuffers::GetFieldT(*table, *field_def));
        if (!VerifyUnion(v, schema, utype, uval, *field_def)) { return false; }
        break;
      }
      default: FLATBUFFERS_ASSERT(false); break;
    }
  }

  if (!v.EndTable()) return false;

  return true;
}